

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Expression * __thiscall
wasm::IRBuilder::fixExtraOutput(IRBuilder *this,ScopeCtx *scope,Name label,Expression *curr)

{
  char **this_00;
  Index index;
  Index index_00;
  Name trampolineLabel;
  Name trampolineLabel_00;
  Name skipLabel;
  Name trampolineLabel_01;
  IRBuilder *pIVar1;
  bool bVar2;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  size_t sVar7;
  Loop *pLVar8;
  uint *puVar9;
  LocalGet *pLVar10;
  TupleMake *right;
  Type receivedType_00;
  optional<wasm::Type> type;
  optional<wasm::Type> type_00;
  undefined1 local_228 [12];
  uintptr_t local_218;
  TupleExtract *local_210;
  uint local_204;
  uintptr_t uStack_200;
  Index j_1;
  LocalGet *local_1f8;
  uintptr_t local_1f0;
  TupleExtract *local_1e8;
  uint local_1dc;
  uintptr_t uStack_1d8;
  Index j;
  LocalGet *local_1d0;
  undefined1 local_1c8 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> elems;
  Result<unsigned_int> local_1a8;
  Index local_17c;
  undefined1 auStack_178 [4];
  uint receivedLocal;
  undefined1 local_170;
  uintptr_t local_168;
  BasicType local_15c;
  size_t local_158;
  char *local_150;
  size_t local_148;
  size_t local_140;
  uintptr_t local_138;
  size_t local_130;
  size_t local_128;
  size_t local_120;
  size_t local_118;
  uintptr_t local_110;
  size_t local_108;
  char *local_100;
  string_view local_f8 [2];
  allocator<wasm::Type> local_d1;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> local_d0;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> local_c0;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> local_b0;
  Tuple local_a0;
  Type local_88;
  Type receivedType;
  Type extraType;
  undefined1 auStack_70 [4];
  value_type extraLocal;
  value_type extraLabel;
  undefined1 auStack_58 [4];
  Index i;
  Name fallthroughLabel;
  Type labelType;
  anon_class_16_2_3efcb345 addTrampoline;
  Expression *curr_local;
  ScopeCtx *scope_local;
  IRBuilder *this_local;
  Name label_local;
  
  labelType.id = (uintptr_t)&addTrampoline.this;
  addTrampoline.curr = (Expression **)this;
  addTrampoline.this = (IRBuilder *)curr;
  fallthroughLabel.super_IString.str._M_str = (char *)ScopeCtx::getLabelType(scope);
  wasm::Name::Name((Name *)auStack_58);
  extraLabel.super_IString.str._M_str._4_4_ = 0;
  do {
    uVar3 = (ulong)extraLabel.super_IString.str._M_str._4_4_;
    sVar4 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::size(&scope->outputLabels);
    if (sVar4 <= uVar3) {
      bVar2 = IString::operator_cast_to_bool((IString *)auStack_58);
      if (bVar2) {
        receivedType_00 = ScopeCtx::getResultType(scope);
        trampolineLabel.super_IString.str._M_str = (char *)fallthroughLabel.super_IString.str._M_len
        ;
        trampolineLabel.super_IString.str._M_len = _auStack_58;
        fixExtraOutput::anon_class_16_2_3efcb345::operator()
                  ((anon_class_16_2_3efcb345 *)&labelType,receivedType_00,trampolineLabel,label);
      }
      return (Expression *)addTrampoline.this;
    }
    pvVar5 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::operator[]
                       (&scope->outputLabels,(ulong)extraLabel.super_IString.str._M_str._4_4_);
    _auStack_70 = (pvVar5->super_IString).str._M_len;
    extraLabel.super_IString.str._M_len = (size_t)(pvVar5->super_IString).str._M_str;
    bVar2 = IString::operator_cast_to_bool((IString *)auStack_70);
    if (bVar2) {
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&scope->outputLocals,(ulong)extraLabel.super_IString.str._M_str._4_4_);
      index = *pvVar6;
      receivedType = Function::getLocalType(this->func,index);
      this_00 = &fallthroughLabel.super_IString.str._M_str;
      local_c0 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
                 wasm::Type::begin((Type *)this_00);
      sVar7 = wasm::Type::size(&receivedType);
      local_b0 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
                 ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator+
                           (&local_c0,sVar7);
      local_d0 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
                 wasm::Type::end((Type *)this_00);
      std::allocator<wasm::Type>::allocator(&local_d1);
      std::vector<wasm::Type,std::allocator<wasm::Type>>::vector<wasm::Type::Iterator,void>
                ((vector<wasm::Type,std::allocator<wasm::Type>> *)&local_a0,(Iterator)local_b0,
                 (Iterator)local_d0,&local_d1);
      wasm::Type::Type(&local_88,&local_a0);
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector(&local_a0);
      std::allocator<wasm::Type>::~allocator(&local_d1);
      pLVar8 = ScopeCtx::getLoop(scope);
      if ((pLVar8 == (Loop *)0x0) ||
         (bVar2 = IString::operator_cast_to_bool((IString *)auStack_58), bVar2)) {
        local_138 = local_88.id;
        local_148 = _auStack_70;
        local_140 = extraLabel.super_IString.str._M_len;
        trampolineLabel_00.super_IString.str._M_str = (char *)extraLabel.super_IString.str._M_len;
        trampolineLabel_00.super_IString.str._M_len = _auStack_70;
        local_158 = label.super_IString.str._M_len;
        local_150 = label.super_IString.str._M_str;
        fixExtraOutput::anon_class_16_2_3efcb345::operator()
                  ((anon_class_16_2_3efcb345 *)&labelType,local_88,trampolineLabel_00,label);
      }
      else {
        local_108 = label.super_IString.str._M_len;
        local_100 = label.super_IString.str._M_str;
        local_f8[0] = (string_view)makeFresh(this,label,0);
        wasm::Name::operator=((Name *)auStack_58,(Name *)local_f8);
        local_110 = local_88.id;
        local_120 = _auStack_70;
        local_118 = extraLabel.super_IString.str._M_len;
        local_130 = _auStack_58;
        local_128 = fallthroughLabel.super_IString.str._M_len;
        trampolineLabel_01.super_IString.str._M_str = (char *)extraLabel.super_IString.str._M_len;
        trampolineLabel_01.super_IString.str._M_len = _auStack_70;
        skipLabel.super_IString.str._M_str = (char *)fallthroughLabel.super_IString.str._M_len;
        skipLabel.super_IString.str._M_len = _auStack_58;
        fixExtraOutput::anon_class_16_2_3efcb345::operator()
                  ((anon_class_16_2_3efcb345 *)&labelType,local_88,trampolineLabel_01,skipLabel);
      }
      local_15c = none;
      bVar2 = wasm::Type::operator==(&local_88,&local_15c);
      if (bVar2) {
        bVar2 = wasm::Type::operator==
                          (&receivedType,(Type *)&fallthroughLabel.super_IString.str._M_str);
        pIVar1 = addTrampoline.this;
        if (!bVar2) {
          __assert_fail("extraType == labelType",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-ir-builder.cpp"
                        ,0x4be,
                        "Expression *wasm::IRBuilder::fixExtraOutput(ScopeCtx &, Name, Expression *)"
                       );
        }
        local_168 = receivedType.id;
        pLVar10 = Builder::makeLocalGet(&this->builder,index,receivedType);
        std::optional<wasm::Type>::optional<wasm::Type_&,_true>
                  ((optional<wasm::Type> *)auStack_178,&receivedType);
        type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._9_7_ = 0;
        type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload =
             (_Storage<wasm::Type,_true>)_auStack_178;
        type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_170;
        addTrampoline.this =
             (IRBuilder *)
             Builder::makeSequence(&this->builder,(Expression *)pIVar1,(Expression *)pLVar10,type);
      }
      else {
        elems.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)local_88.id;
        addScratchLocal(&local_1a8,this,local_88);
        puVar9 = Result<unsigned_int>::operator*(&local_1a8);
        index_00 = *puVar9;
        Result<unsigned_int>::~Result(&local_1a8);
        local_17c = index_00;
        addTrampoline.this =
             (IRBuilder *)
             Builder::makeLocalSet(&this->builder,index_00,(Expression *)addTrampoline.this);
        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
                  ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_1c8);
        bVar2 = wasm::Type::isSingle(&receivedType);
        if (bVar2) {
          uStack_1d8 = receivedType.id;
          local_1d0 = Builder::makeLocalGet(&this->builder,index,receivedType);
          std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                    ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_1c8,
                     (value_type *)&local_1d0);
        }
        else {
          for (local_1dc = 0; uVar3 = (ulong)local_1dc, sVar7 = wasm::Type::size(&receivedType),
              uVar3 < sVar7; local_1dc = local_1dc + 1) {
            local_1f0 = receivedType.id;
            pLVar10 = Builder::makeLocalGet(&this->builder,index,receivedType);
            local_1e8 = Builder::makeTupleExtract(&this->builder,(Expression *)pLVar10,local_1dc);
            std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                      ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_1c8,
                       (value_type *)&local_1e8);
          }
        }
        bVar2 = wasm::Type::isSingle(&local_88);
        if (bVar2) {
          uStack_200 = local_88.id;
          local_1f8 = Builder::makeLocalGet(&this->builder,local_17c,local_88);
          std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                    ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_1c8,
                     (value_type *)&local_1f8);
        }
        else {
          for (local_204 = 0; uVar3 = (ulong)local_204, sVar7 = wasm::Type::size(&local_88),
              uVar3 < sVar7; local_204 = local_204 + 1) {
            local_218 = local_88.id;
            pLVar10 = Builder::makeLocalGet(&this->builder,local_17c,local_88);
            local_210 = Builder::makeTupleExtract(&this->builder,(Expression *)pLVar10,local_204);
            std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                      ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_1c8,
                       (value_type *)&local_210);
          }
        }
        pIVar1 = addTrampoline.this;
        right = Builder::
                makeTupleMake<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>&>
                          (&this->builder,
                           (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                           local_1c8);
        std::optional<wasm::Type>::optional<wasm::Type_&,_true>
                  ((optional<wasm::Type> *)local_228,
                   (Type *)&fallthroughLabel.super_IString.str._M_str);
        type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._12_4_ = 0;
        type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload =
             (_Storage<wasm::Type,_true>)local_228._0_8_;
        type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_228[8];
        type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._9_3_ = local_228._9_3_;
        addTrampoline.this =
             (IRBuilder *)
             Builder::makeSequence(&this->builder,(Expression *)pIVar1,(Expression *)right,type_00);
        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector
                  ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_1c8);
      }
    }
    extraLabel.super_IString.str._M_str._4_4_ = extraLabel.super_IString.str._M_str._4_4_ + 1;
  } while( true );
}

Assistant:

Expression*
IRBuilder::fixExtraOutput(ScopeCtx& scope, Name label, Expression* curr) {
  // Add a trampoline branch target. Reuse unnamed blocks.
  auto addTrampoline =
    [&](Type receivedType, Name trampolineLabel, Name skipLabel) {
      if (auto* block = curr->dynCast<Block>(); block && !block->name) {
        block->name = trampolineLabel;
        if (block->list.back()->type == Type::none) {
          block->list.push_back(builder.makeBreak(skipLabel));
        } else {
          block->list.back() = builder.makeBreak(skipLabel, block->list.back());
        }
        block->type = receivedType;
      } else {
        assert(curr->type != Type::none);
        curr = builder.makeBlock(
          trampolineLabel, {builder.makeBreak(skipLabel, curr)}, receivedType);
      }
    };

  auto labelType = scope.getLabelType();
  Name fallthroughLabel;
  for (Index i = 0; i < scope.outputLabels.size(); ++i) {
    auto extraLabel = scope.outputLabels[i];
    if (!extraLabel) {
      continue;
    }

    auto extraLocal = scope.outputLocals[i];
    auto extraType = func->getLocalType(extraLocal);
    Type receivedType =
      Tuple(labelType.begin() + extraType.size(), labelType.end());

    // For normal blocks, the original fallthrough values can be sent to the
    // scope label and they will end up in the right place, but for loops, the
    // fallthrough values should _not_ go to the scope label. We will add a new
    // branch target at the end to send the fallthrough values to.
    if (scope.getLoop() && !fallthroughLabel) {
      fallthroughLabel = makeFresh(label);
      addTrampoline(receivedType, extraLabel, fallthroughLabel);
    } else {
      addTrampoline(receivedType, extraLabel, label);
    }

    // If all the received values are in the scratch local, just fetch them out.
    if (receivedType == Type::none) {
      assert(extraType == labelType);
      curr = builder.makeSequence(
        curr, builder.makeLocalGet(extraLocal, extraType), extraType);
      continue;
    }

    // Otherwise, we have to reorder the received values past the extra values
    // from the scratch local using an additional scratch local.
    auto receivedLocal = *addScratchLocal(receivedType);
    curr = builder.makeLocalSet(receivedLocal, curr);

    // Concatenate the extra values and received values into a tuple.
    std::vector<Expression*> elems;
    if (extraType.isSingle()) {
      elems.push_back(builder.makeLocalGet(extraLocal, extraType));
    } else {
      for (Index j = 0; j < extraType.size(); ++j) {
        elems.push_back(builder.makeTupleExtract(
          builder.makeLocalGet(extraLocal, extraType), j));
      }
    }
    if (receivedType.isSingle()) {
      elems.push_back(builder.makeLocalGet(receivedLocal, receivedType));
    } else {
      for (Index j = 0; j < receivedType.size(); ++j) {
        elems.push_back(builder.makeTupleExtract(
          builder.makeLocalGet(receivedLocal, receivedType), j));
      }
    }

    curr = builder.makeSequence(curr, builder.makeTupleMake(elems), labelType);
  }

  if (fallthroughLabel) {
    // The loop fallthrough values need to propagate to one final trampoline.
    addTrampoline(scope.getResultType(), fallthroughLabel, label);
  }
  return curr;
}